

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.hpp
# Opt level: O2

margin_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_> * __thiscall
plot::detail::margin_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>::next
          (margin_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>
           *__return_storage_ptr__,
          margin_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_> *this)

{
  block_t *pbVar1;
  ptrdiff_t pVar2;
  Frame<plot::RealCanvas<plot::BrailleCanvas>_*> *pFVar3;
  BrailleCanvas *pBVar4;
  block_t *pbVar5;
  long lVar6;
  Margin<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_> *pMVar7;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  if ((this->overflow_ == 0) &&
     (((this->line_).line_.line_.line_.it_._M_current !=
       (this->end_).line_.line_.line_.it_._M_current ||
      ((this->line_).line_.overflow_ != (this->end_).line_.overflow_)))) {
    pMVar7 = this->margin_;
    local_58 = *(undefined4 *)&(this->line_).line_.frame_;
    uStack_54 = *(undefined4 *)((long)&(this->line_).line_.frame_ + 4);
    uStack_50 = (undefined4)(this->line_).line_.overflow_;
    uStack_4c = *(undefined4 *)((long)&(this->line_).line_.overflow_ + 4);
    local_48 = *(undefined4 *)&(this->line_).line_.line_.line_.canvas_;
    uStack_44 = *(undefined4 *)((long)&(this->line_).line_.line_.line_.canvas_ + 4);
    uStack_40 = *(undefined4 *)&(this->line_).line_.line_.line_.it_._M_current;
    uStack_3c = *(undefined4 *)((long)&(this->line_).line_.line_.line_.it_._M_current + 4);
    local_38 = *(undefined4 *)&(this->line_).line_.end_.line_.canvas_;
    uStack_34 = *(undefined4 *)((long)&(this->line_).line_.end_.line_.canvas_ + 4);
    uStack_30 = *(undefined4 *)&(this->line_).line_.end_.line_.it_._M_current;
    uStack_2c = *(undefined4 *)((long)&(this->line_).line_.end_.line_.it_._M_current + 4);
    std::
    __advance<plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>*>>,long>
              (&local_58,1);
    (__return_storage_ptr__->line_).line_.end_.line_.canvas_ =
         (BrailleCanvas *)CONCAT44(uStack_34,local_38);
    (__return_storage_ptr__->line_).line_.end_.line_.it_._M_current =
         (block_t *)CONCAT44(uStack_2c,uStack_30);
    (__return_storage_ptr__->line_).line_.line_.line_.canvas_ =
         (BrailleCanvas *)CONCAT44(uStack_44,local_48);
    (__return_storage_ptr__->line_).line_.line_.line_.it_._M_current =
         (block_t *)CONCAT44(uStack_3c,uStack_40);
    (__return_storage_ptr__->line_).line_.frame_ =
         (Frame<plot::RealCanvas<plot::BrailleCanvas>_*> *)CONCAT44(uStack_54,local_58);
    (__return_storage_ptr__->line_).line_.overflow_ = CONCAT44(uStack_4c,uStack_50);
    lVar6 = 0;
  }
  else {
    pMVar7 = this->margin_;
    lVar6 = this->overflow_ + 1;
    pbVar1 = (this->line_).line_.end_.line_.it_._M_current;
    (__return_storage_ptr__->line_).line_.end_.line_.canvas_ =
         (this->line_).line_.end_.line_.canvas_;
    (__return_storage_ptr__->line_).line_.end_.line_.it_._M_current = pbVar1;
    pbVar1 = (this->line_).line_.line_.line_.it_._M_current;
    (__return_storage_ptr__->line_).line_.line_.line_.canvas_ =
         (this->line_).line_.line_.line_.canvas_;
    (__return_storage_ptr__->line_).line_.line_.line_.it_._M_current = pbVar1;
    pVar2 = (this->line_).line_.overflow_;
    (__return_storage_ptr__->line_).line_.frame_ = (this->line_).line_.frame_;
    (__return_storage_ptr__->line_).line_.overflow_ = pVar2;
  }
  pFVar3 = (this->end_).line_.frame_;
  pVar2 = (this->end_).line_.overflow_;
  pBVar4 = (this->end_).line_.line_.line_.canvas_;
  pbVar1 = (this->end_).line_.line_.line_.it_._M_current;
  pbVar5 = (this->end_).line_.end_.line_.it_._M_current;
  (__return_storage_ptr__->end_).line_.end_.line_.canvas_ = (this->end_).line_.end_.line_.canvas_;
  (__return_storage_ptr__->end_).line_.end_.line_.it_._M_current = pbVar5;
  (__return_storage_ptr__->end_).line_.line_.line_.canvas_ = pBVar4;
  (__return_storage_ptr__->end_).line_.line_.line_.it_._M_current = pbVar1;
  (__return_storage_ptr__->end_).line_.frame_ = pFVar3;
  (__return_storage_ptr__->end_).line_.overflow_ = pVar2;
  __return_storage_ptr__->margin_ = pMVar7;
  __return_storage_ptr__->overflow_ = lVar6;
  return __return_storage_ptr__;
}

Assistant:

margin_line next() const {
            return (overflow_ || line_ == end_) ? margin_line(margin_, overflow_ + 1, line_, end_)
                                                : margin_line(margin_, overflow_, std::next(line_), end_);
        }